

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O3

REF_STATUS ref_shard_mark_to_split(REF_SHARD ref_shard,REF_INT node0,REF_INT node1)

{
  int iVar1;
  REF_INT *pRVar2;
  uint uVar3;
  undefined8 in_RAX;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  REF_INT face;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  uVar3 = ref_face_spanning(ref_shard->face,node0,node1,&local_24);
  if (uVar3 == 0) {
    pRVar2 = ref_shard->face->f2n;
    lVar4 = (long)local_24;
    iVar1 = pRVar2[lVar4 * 4 + 2];
    if (iVar1 == node0 || iVar1 == node1) {
      if (ref_shard->mark[lVar4] != 3) {
        ref_shard->mark[lVar4] = 2;
        return 0;
      }
      pcVar7 = "2-3 mark mismatch";
      uVar5 = 0x49;
    }
    else {
      iVar1 = pRVar2[(int)(local_24 * 4 | 3)];
      if (iVar1 != node0 && iVar1 != node1) {
        return 1;
      }
      if (ref_shard->mark[lVar4] != 2) {
        ref_shard->mark[lVar4] = 3;
        return 0;
      }
      pcVar7 = "3-2 mark mismatch";
      uVar5 = 0x51;
    }
    uVar3 = 1;
    uVar6 = 1;
  }
  else {
    pcVar7 = "missing face";
    uVar5 = 0x44;
    uVar6 = (ulong)uVar3;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar5,
         "ref_shard_mark_to_split",uVar6,pcVar7);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_shard_mark_to_split(REF_SHARD ref_shard, REF_INT node0,
                                           REF_INT node1) {
  REF_INT face;

  RSS(ref_face_spanning(ref_shard_face(ref_shard), node0, node1, &face),
      "missing face");

  if (node0 == ref_face_f2n(ref_shard_face(ref_shard), 2, face) ||
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 2, face)) {
    if (3 == ref_shard_mark(ref_shard, face))
      RSS(REF_FAILURE, "2-3 mark mismatch");
    ref_shard_mark(ref_shard, face) = 2;
    return REF_SUCCESS;
  }

  if (node0 == ref_face_f2n(ref_shard_face(ref_shard), 3, face) ||
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 3, face)) {
    if (2 == ref_shard_mark(ref_shard, face))
      RSS(REF_FAILURE, "3-2 mark mismatch");
    ref_shard_mark(ref_shard, face) = 3;
    return REF_SUCCESS;
  }

  return REF_FAILURE;
}